

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_hash_map.h
# Opt level: O2

void __thiscall
crnlib::
hash_map<crnlib::qdxt1::cluster_id,_unsigned_int,_crnlib::hasher<crnlib::qdxt1::cluster_id>,_crnlib::equal_to<crnlib::qdxt1::cluster_id>_>
::raw_node::raw_node(raw_node *this,raw_node *other)

{
  node *pDst;
  bool bVar1;
  
  bVar1 = other->m_bits[0x1c] != '\0';
  if (bVar1) {
    construct_value_type((value_type *)this,(value_type *)other);
  }
  this->m_bits[0x1c] = bVar1;
  return;
}

Assistant:

inline raw_node(const raw_node& other)
            {
                node* pDst = reinterpret_cast<node*>(this);
                const node* pSrc = reinterpret_cast<const node*>(&other);

                if (pSrc->state)
                {
                    hash_map_type::construct_value_type(pDst, pSrc);
                    pDst->state = cStateValid;
                }
                else
                {
                    pDst->state = cStateInvalid;
                }
            }